

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::unload_module(Server *this,string *module)

{
  type pvVar1;
  bool bVar2;
  reference __in;
  type *ppvVar3;
  code *pcVar4;
  ostream *poVar5;
  ModuleUnload module_unload;
  type handle;
  _Self local_20;
  iterator m;
  string *module_local;
  Server *this_local;
  
  m._M_node = (_Base_ptr)module;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::find(&this->loaded_modules,module);
  handle = (type)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                 ::end(&this->loaded_modules);
  bVar2 = std::operator!=(&local_20,(_Self *)&handle);
  if (bVar2) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
           ::operator*(&local_20);
    ppvVar3 = std::get<1ul,std::__cxx11::string_const,void*>(__in);
    pvVar1 = *ppvVar3;
    std::
    map<std::__cxx11::string,void*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,void*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
                        *)&this->loaded_modules,(iterator)local_20._M_node);
    pcVar4 = (code *)dlsym(pvVar1,"module_unload");
    (*pcVar4)(this);
    dlclose(pvVar1);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Module ");
    poVar5 = std::operator<<(poVar5,(string *)module);
    std::operator<<(poVar5," is not loaded!\n");
  }
  return;
}

Assistant:

void Server::unload_module(std::string module) {
    auto m = this->loaded_modules.find(module);
    if (m != this->loaded_modules.end()) {
        auto handle = std::get<1>(*m);
        this->loaded_modules.erase(m);
        auto module_unload = (ModuleUnload) dlsym(handle, "module_unload");
        module_unload(this);
        dlclose(handle);
    } else {
        std::cout << "Module " << module << " is not loaded!\n";
    }
}